

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
license::unbase64(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
                 string *base64_data)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  uint uVar5;
  ulong uVar6;
  string tmp_str;
  byte local_69;
  ulong local_68;
  char *local_60;
  ulong local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  ulong local_48;
  
  std::__cxx11::string::string((string *)&local_50,(string *)base64_data);
  local_69 = 10;
  _Var4 = std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (local_50,local_50._M_current + local_48,(_Iter_equals_val<const_char>)&local_69
                    );
  std::__cxx11::string::erase(&local_50,_Var4._M_current,local_50._M_current + local_48);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_48 < 2) {
    puts("ERROR: You passed an invalid base64 string (too short). You get NULL back.");
  }
  else {
    uVar6 = (ulong)((local_50._M_current[local_48 - 1] == '=') + 1);
    if (local_50._M_current[local_48 - 2] != '=') {
      uVar6 = (ulong)(local_50._M_current[local_48 - 1] == '=');
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (__return_storage_ptr__,(local_48 * 3 >> 2) - uVar6);
    local_58 = (local_48 - uVar6) - 4;
    local_60 = local_50._M_current;
    local_68 = uVar6;
    for (uVar5 = 0; uVar6 = (ulong)uVar5, uVar6 <= local_58; uVar5 = uVar5 + 4) {
      bVar1 = unb64[(byte)local_60[uVar5 + 1]];
      bVar2 = unb64[(byte)local_60[uVar5 + 2]];
      bVar3 = unb64[(byte)local_60[uVar5 + 3]];
      local_69 = bVar1 >> 4 | unb64[(byte)local_60[uVar6]] << 2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,&local_69);
      local_69 = bVar2 >> 2 | bVar1 << 4;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,&local_69);
      local_69 = bVar3 | bVar2 << 6;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,&local_69);
    }
    if (local_68 == 2) {
      local_69 = (byte)unb64[(byte)local_60[uVar5 + 1]] >> 4 | unb64[(byte)local_60[uVar6]] << 2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,&local_69);
    }
    else if ((int)local_68 == 1) {
      bVar1 = unb64[(byte)local_60[uVar5 + 1]];
      bVar2 = unb64[(byte)local_60[uVar5 + 2]];
      local_69 = bVar1 >> 4 | unb64[(byte)local_60[uVar6]] << 2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,&local_69);
      local_69 = bVar2 >> 2 | bVar1 << 4;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,&local_69);
    }
  }
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> unbase64(const std::string& base64_data) {
	string tmp_str(base64_data);
	tmp_str.erase(std::remove(tmp_str.begin(), tmp_str.end(), '\n'), tmp_str.end());
	const unsigned char* safeAsciiPtr = (const unsigned char*)tmp_str.c_str();
	std::vector<uint8_t> bin;
	// int cb = 0;
	unsigned int charNo;
	int pad = 0;
	size_t len = tmp_str.size();

	if (len < 2) {  // 2 accesses below would be OOB.
		// catch empty string, return NULL as result.
		puts("ERROR: You passed an invalid base64 string (too short). You get NULL back.");
		return bin;
	}
	if (safeAsciiPtr[len - 1] == '=') ++pad;
	if (safeAsciiPtr[len - 2] == '=') ++pad;

	size_t flen = 3 * len / 4 - pad;
	bin.reserve(flen);

	for (charNo = 0; charNo <= len - 4 - pad; charNo += 4) {
		int A = unb64[safeAsciiPtr[charNo]];
		int B = unb64[safeAsciiPtr[charNo + 1]];
		int C = unb64[safeAsciiPtr[charNo + 2]];
		int D = unb64[safeAsciiPtr[charNo + 3]];

		bin.push_back((A << 2) | (B >> 4));
		bin.push_back((B << 4) | (C >> 2));
		bin.push_back((C << 6) | (D));
	}

	if (pad == 1) {
		int A = unb64[safeAsciiPtr[charNo]];
		int B = unb64[safeAsciiPtr[charNo + 1]];
		int C = unb64[safeAsciiPtr[charNo + 2]];
		bin.push_back((A << 2) | (B >> 4));
		bin.push_back((B << 4) | (C >> 2));
	} else if (pad == 2) {
		int A = unb64[safeAsciiPtr[charNo]];
		int B = unb64[safeAsciiPtr[charNo + 1]];
		bin.push_back((A << 2) | (B >> 4));
	}

	return bin;
}